

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_init_encoder_lzma(archive *a,la_zstream *lastrm,int level,uint64_t filter_id)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  archive *in_RDI;
  int r;
  lzma_options_lzma lzma_opt;
  lzma_filter *lzmafilters;
  lzma_stream *strm;
  archive *in_stack_ffffffffffffff48;
  int local_ac;
  undefined1 local_a8 [112];
  undefined8 *local_38;
  void *local_30;
  undefined8 local_28;
  int local_1c;
  long local_18;
  archive *local_10;
  int local_4;
  
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (*(int *)(in_RSI + 0x40) != 0) {
    compression_end(in_stack_ffffffffffffff48,(la_zstream *)0x184e79);
  }
  local_30 = calloc(1,0xa8);
  if (local_30 == (void *)0x0) {
    archive_set_error(local_10,0xc,"Can\'t allocate memory for lzma stream");
    local_4 = -0x1e;
  }
  else {
    local_38 = (undefined8 *)((long)local_30 + 0x88);
    if (6 < local_1c) {
      local_1c = 6;
    }
    cVar1 = lzma_lzma_preset(local_a8,local_1c);
    if (cVar1 == '\0') {
      *local_38 = local_28;
      local_38[1] = local_a8;
      local_38[2] = 0xffffffffffffffff;
      iVar2 = lzma_properties_size(local_18 + 0x30,local_38);
      if (iVar2 == 0) {
        if (*(int *)(local_18 + 0x30) != 0) {
          pvVar3 = malloc((ulong)*(uint *)(local_18 + 0x30));
          *(void **)(local_18 + 0x38) = pvVar3;
          if (*(long *)(local_18 + 0x38) == 0) {
            free(local_30);
            *(undefined8 *)(local_18 + 0x48) = 0;
            archive_set_error(local_10,0xc,"Cannot allocate memory");
            return -0x1e;
          }
          iVar2 = lzma_properties_encode(local_38,*(undefined8 *)(local_18 + 0x38));
          if (iVar2 != 0) {
            free(local_30);
            *(undefined8 *)(local_18 + 0x48) = 0;
            archive_set_error(local_10,-1,"lzma_properties_encode failed");
            return -0x1e;
          }
        }
        memcpy(local_30,&compression_init_encoder_lzma::lzma_init_data,0x88);
        iVar2 = lzma_raw_encoder(local_30,local_38);
        if (iVar2 == 0) {
          *(void **)(local_18 + 0x48) = local_30;
          *(undefined4 *)(local_18 + 0x40) = 1;
          *(code **)(local_18 + 0x50) = compression_code_lzma;
          *(code **)(local_18 + 0x58) = compression_end_lzma;
          local_ac = 0;
        }
        else if (iVar2 == 5) {
          free(local_30);
          *(undefined8 *)(local_18 + 0x48) = 0;
          archive_set_error(local_10,0xc,
                            "Internal error initializing compression library: Cannot allocate memory"
                           );
          local_ac = -0x1e;
        }
        else {
          free(local_30);
          *(undefined8 *)(local_18 + 0x48) = 0;
          archive_set_error(local_10,-1,
                            "Internal error initializing compression library: It\'s a bug in liblzma"
                           );
          local_ac = -0x1e;
        }
        local_4 = local_ac;
      }
      else {
        free(local_30);
        *(undefined8 *)(local_18 + 0x48) = 0;
        archive_set_error(local_10,-1,"lzma_properties_size failed");
        local_4 = -0x1e;
      }
    }
    else {
      free(local_30);
      *(undefined8 *)(local_18 + 0x48) = 0;
      archive_set_error(local_10,0xc,"Internal error initializing compression library");
      local_4 = -0x1e;
    }
  }
  return local_4;
}

Assistant:

static int
compression_init_encoder_lzma(struct archive *a,
    struct la_zstream *lastrm, int level, uint64_t filter_id)
{
	static const lzma_stream lzma_init_data = LZMA_STREAM_INIT;
	lzma_stream *strm;
	lzma_filter *lzmafilters;
	lzma_options_lzma lzma_opt;
	int r;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm) + sizeof(*lzmafilters) * 2);
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for lzma stream");
		return (ARCHIVE_FATAL);
	}
	lzmafilters = (lzma_filter *)(strm+1);
	if (level > 6)
		level = 6;
	if (lzma_lzma_preset(&lzma_opt, level)) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lzmafilters[0].id = filter_id;
	lzmafilters[0].options = &lzma_opt;
	lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */

	r = lzma_properties_size(&(lastrm->prop_size), lzmafilters);
	if (r != LZMA_OK) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "lzma_properties_size failed");
		return (ARCHIVE_FATAL);
	}
	if (lastrm->prop_size) {
		lastrm->props = malloc(lastrm->prop_size);
		if (lastrm->props == NULL) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ENOMEM,
			    "Cannot allocate memory");
			return (ARCHIVE_FATAL);
		}
		r = lzma_properties_encode(lzmafilters,  lastrm->props);
		if (r != LZMA_OK) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "lzma_properties_encode failed");
			return (ARCHIVE_FATAL);
		}
	}

	*strm = lzma_init_data;
	r = lzma_raw_encoder(strm, lzmafilters);
	switch (r) {
	case LZMA_OK:
		lastrm->real_stream = strm;
		lastrm->valid = 1;
		lastrm->code = compression_code_lzma;
		lastrm->end = compression_end_lzma;
		r = ARCHIVE_OK;
		break;
	case LZMA_MEM_ERROR:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library: "
		    "Cannot allocate memory");
		r =  ARCHIVE_FATAL;
		break;
        default:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "It's a bug in liblzma");
		r =  ARCHIVE_FATAL;
		break;
	}
	return (r);
}